

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____26::test()::ComponentAddedEventReceiver::
receive(entityx::ComponentAddedEvent<Direction>_const__
          (ComponentAddedEventReceiver *this,ComponentAddedEvent<Direction> *event)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<const_float_&> EVar1;
  long in_RSI;
  float *in_RDI;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  float n;
  ComponentHandle<Direction,_entityx::EntityManager> p;
  undefined4 in_stack_fffffffffffffe18;
  Flags in_stack_fffffffffffffe1c;
  AssertionHandler *in_stack_fffffffffffffe20;
  StringRef *in_stack_fffffffffffffe28;
  SourceLineInfo *this_00;
  AssertionHandler *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  SourceLineInfo *this_01;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  SourceLineInfo local_158;
  StringRef local_148;
  float local_f0;
  float *local_d8;
  SourceLineInfo local_90;
  StringRef local_80;
  float local_24;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = *(undefined8 *)(in_RSI + 0x18);
  local_18 = *(undefined8 *)(in_RSI + 0x20);
  local_24 = (float)(int)in_RDI[0x11];
  local_80 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffe20,
                        CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this_01 = &local_90;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x168);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
  capturedExpression.m_size = (size_type)this_01;
  capturedExpression.m_start = in_stack_fffffffffffffe38;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (SourceLineInfo *)in_stack_fffffffffffffe20,capturedExpression,
             in_stack_fffffffffffffe1c);
  entityx::ComponentHandle<Direction,_entityx::EntityManager>::operator->
            ((ComponentHandle<Direction,_entityx::EntityManager> *)in_stack_fffffffffffffe20);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (float *)0x2a51cb);
  local_f0 = -local_24;
  local_d8 = EVar1.m_lhs;
  Catch::ExprLhs<float_const&>::operator==
            ((ExprLhs<const_float_&> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
             ,in_RDI);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffe20,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
            ((BinaryExpr<const_float_&,_const_float_&> *)0x2a523f);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe20);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe20);
  local_148 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffe20,
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this_00 = &local_158;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x169);
  Catch::StringRef::StringRef((StringRef *)in_stack_fffffffffffffe30,(char *)this_00);
  capturedExpression_00.m_size = (size_type)this_01;
  capturedExpression_00.m_start = (char *)EVar1.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe30,(StringRef *)this_00,
             (SourceLineInfo *)in_stack_fffffffffffffe20,capturedExpression_00,
             in_stack_fffffffffffffe1c);
  entityx::ComponentHandle<Direction,_entityx::EntityManager>::operator->
            ((ComponentHandle<Direction,_entityx::EntityManager> *)in_stack_fffffffffffffe20);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (float *)0x2a5365);
  Catch::ExprLhs<float_const&>::operator==
            ((ExprLhs<const_float_&> *)(CONCAT44(in_stack_fffffffffffffe5c,local_24) ^ 0x80000000),
             in_RDI);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)EVar1.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
            ((BinaryExpr<const_float_&,_const_float_&> *)0x2a53c4);
  Catch::AssertionHandler::complete((AssertionHandler *)EVar1.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)EVar1.m_lhs);
  in_RDI[0x11] = (float)((int)in_RDI[0x11] + 1);
  return;
}

Assistant:

void receive(const ComponentAddedEvent<Direction> &event) {
      auto p = event.component;
      float n = static_cast<float>(direction_events);
      REQUIRE(p->x ==  -n);
      REQUIRE(p->y ==  -n);
      direction_events++;
    }